

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.hpp
# Opt level: O2

BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *
duckdb::BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(ART *art,Node *node)

{
  FixedSizeAllocator *this;
  IndexPointer IVar1;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *pBVar2;
  Node ptr;
  
  this = Node::GetAllocator(art,NODE_7_LEAF);
  IVar1 = FixedSizeAllocator::New(this);
  ptr.super_IndexPointer.data = (IndexPointer)(IVar1.data & 0xffffffffffffff | 0x800000000000000);
  (node->super_IndexPointer).data = (idx_t)ptr;
  pBVar2 = Node::Ref<duckdb::BaseLeaf<(unsigned_char)7,(duckdb::NType)8>>(art,ptr,NODE_7_LEAF);
  pBVar2->count = '\0';
  return pBVar2;
}

Assistant:

static BaseLeaf &New(ART &art, Node &node) {
		node = Node::GetAllocator(art, TYPE).New();
		node.SetMetadata(static_cast<uint8_t>(TYPE));

		auto &n = Node::Ref<BaseLeaf>(art, node, TYPE);
		n.count = 0;
		return n;
	}